

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void vkt::sr::anon_unknown_0::eval_add_uvec2(ShaderEvalContext *c)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  
  fVar3 = c->in[1].m_data[1];
  uVar2 = *(undefined8 *)(c->in[0].m_data + 3);
  fVar8 = (float)uVar2;
  fVar9 = (float)((ulong)uVar2 >> 0x20);
  fVar1 = c->in[0].m_data[1];
  uVar4 = (uint)fVar3;
  uVar6 = (uint)fVar1;
  uVar5 = (uint)fVar8;
  uVar7 = (uint)fVar9;
  auVar10._0_4_ =
       ((int)uVar5 >> 0x1f & (int)(fVar8 - 2.1474836e+09) | uVar5) +
       ((int)(fVar3 - 2.1474836e+09) & (int)uVar4 >> 0x1f | uVar4);
  auVar10._4_4_ = 0;
  auVar10._8_4_ =
       ((int)uVar7 >> 0x1f & (int)(fVar9 - 2.1474836e+09) | uVar7) +
       ((int)(fVar1 - 2.1474836e+09) & (int)uVar6 >> 0x1f | uVar6);
  auVar10._12_4_ = 0;
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44((float)(SUB168(auVar10 | _DAT_00ac4a10,8) - DAT_00ac4a10._8_8_),
                (float)(SUB168(auVar10 | _DAT_00ac4a10,0) - (double)DAT_00ac4a10));
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }